

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

void helper_msa_adds_a_h_mips(CPUMIPSState *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  int64_t iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = (ulong)wd * 0x10;
  lVar4 = (ulong)ws * 0x10;
  lVar2 = (ulong)wt * 0x10;
  iVar1 = msa_adds_a_df(1,(long)*(short *)((env->active_fpu).fpr + ws),
                        (long)*(short *)((env->active_fpu).fpr + wt));
  *(short *)((env->active_fpu).fpr + wd) = (short)iVar1;
  iVar1 = msa_adds_a_df(1,(long)*(short *)((long)(env->active_fpu).fpr + lVar4 + 2),
                        (long)*(short *)((long)(env->active_fpu).fpr + lVar2 + 2));
  *(short *)((long)(env->active_fpu).fpr + lVar3 + 2) = (short)iVar1;
  iVar1 = msa_adds_a_df(1,(long)*(short *)((long)(env->active_fpu).fpr + lVar4 + 4),
                        (long)*(short *)((long)(env->active_fpu).fpr + lVar2 + 4));
  *(short *)((long)(env->active_fpu).fpr + lVar3 + 4) = (short)iVar1;
  iVar1 = msa_adds_a_df(1,(long)*(short *)((long)(env->active_fpu).fpr + lVar4 + 6),
                        (long)*(short *)((long)(env->active_fpu).fpr + lVar2 + 6));
  *(short *)((long)(env->active_fpu).fpr + lVar3 + 6) = (short)iVar1;
  iVar1 = msa_adds_a_df(1,(long)*(short *)((long)(env->active_fpu).fpr + lVar4 + 8),
                        (long)*(short *)((long)(env->active_fpu).fpr + lVar2 + 8));
  *(short *)((long)(env->active_fpu).fpr + lVar3 + 8) = (short)iVar1;
  iVar1 = msa_adds_a_df(1,(long)*(short *)((long)(env->active_fpu).fpr + lVar4 + 10),
                        (long)*(short *)((long)(env->active_fpu).fpr + lVar2 + 10));
  *(short *)((long)(env->active_fpu).fpr + lVar3 + 10) = (short)iVar1;
  iVar1 = msa_adds_a_df(1,(long)*(short *)((long)(env->active_fpu).fpr + lVar4 + 0xc),
                        (long)*(short *)((long)(env->active_fpu).fpr + lVar2 + 0xc));
  *(short *)((long)(env->active_fpu).fpr + lVar3 + 0xc) = (short)iVar1;
  iVar1 = msa_adds_a_df(1,(long)*(short *)((long)(env->active_fpu).fpr + lVar4 + 0xe),
                        (long)*(short *)((long)(env->active_fpu).fpr + lVar2 + 0xe));
  *(short *)((long)(env->active_fpu).fpr + lVar3 + 0xe) = (short)iVar1;
  return;
}

Assistant:

void helper_msa_adds_a_h(CPUMIPSState *env,
                         uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->h[0]  = msa_adds_a_df(DF_HALF, pws->h[0],  pwt->h[0]);
    pwd->h[1]  = msa_adds_a_df(DF_HALF, pws->h[1],  pwt->h[1]);
    pwd->h[2]  = msa_adds_a_df(DF_HALF, pws->h[2],  pwt->h[2]);
    pwd->h[3]  = msa_adds_a_df(DF_HALF, pws->h[3],  pwt->h[3]);
    pwd->h[4]  = msa_adds_a_df(DF_HALF, pws->h[4],  pwt->h[4]);
    pwd->h[5]  = msa_adds_a_df(DF_HALF, pws->h[5],  pwt->h[5]);
    pwd->h[6]  = msa_adds_a_df(DF_HALF, pws->h[6],  pwt->h[6]);
    pwd->h[7]  = msa_adds_a_df(DF_HALF, pws->h[7],  pwt->h[7]);
}